

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFlateDecodeTester.cpp
# Opt level: O3

int InputFlateDecodeTester(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  IByteWriterWithPosition *inWriter;
  IByteReader *inSourceReader;
  LongBufferSizeType LVar4;
  ostream *poVar5;
  bool bVar6;
  Byte buffer;
  string aString;
  InputFile inputFile;
  OutputFlateEncodeStream outputEncoder;
  InputFlateDecodeStream inputDecoder;
  OutputFile outputFile;
  byte local_141;
  string local_140;
  long *local_120;
  LongBufferSizeType local_118;
  long local_110 [2];
  InputFile local_100;
  string local_d0;
  OutputFlateEncodeStream local_b0;
  InputFlateDecodeStream local_88;
  OutputFile local_60;
  
  OutputFile::OutputFile(&local_60);
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"hello world","");
  InputFlateDecodeStream::InputFlateDecodeStream(&local_88);
  OutputFlateEncodeStream::OutputFlateEncodeStream(&local_b0);
  paVar1 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"source.txt","");
  BuildRelativeOutputPath(&local_100.mFilePath,(char **)argv[2],&local_140);
  OutputFile::OpenFile(&local_60,&local_100.mFilePath,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.mFilePath._M_dataplus._M_p != &local_100.mFilePath.field_2) {
    operator_delete(local_100.mFilePath._M_dataplus._M_p,
                    local_100.mFilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  inWriter = OutputFile::GetOutputStream(&local_60);
  OutputFlateEncodeStream::Assign(&local_b0,inWriter,true);
  OutputFlateEncodeStream::Write(&local_b0,(Byte *)local_120,local_118);
  OutputFlateEncodeStream::Assign(&local_b0,(IByteWriterWithPosition *)0x0,true);
  OutputFile::CloseFile(&local_60);
  InputFile::InputFile(&local_100);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"source.txt","");
  BuildRelativeOutputPath(&local_140,(char **)argv[2],&local_d0);
  InputFile::OpenFile(&local_100,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  inSourceReader = &InputFile::GetInputStream(&local_100)->super_IByteReader;
  InputFlateDecodeStream::Assign(&local_88,inSourceReader);
  if (local_118 == 0) {
    bVar6 = true;
  }
  else {
    plVar2 = local_120;
    while( true ) {
      LVar4 = InputFlateDecodeStream::Read(&local_88,&local_141,1);
      if (LVar4 != 1) break;
      lVar3 = *plVar2;
      bVar6 = (int)(char)lVar3 == (uint)local_141;
      if (((long *)((long)plVar2 + 1) == (long *)((long)local_120 + local_118)) ||
         (plVar2 = (long *)((long)plVar2 + 1), (int)(char)lVar3 != (uint)local_141))
      goto LAB_0013b390;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Read failes. expected ",0x16);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," characters. Found",0x12);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    bVar6 = false;
  }
LAB_0013b390:
  InputFlateDecodeStream::Assign(&local_88,(IByteReader *)0x0);
  InputFile::CloseFile(&local_100);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Read failes. different characters than what expected\n",0x35);
  }
  InputFile::~InputFile(&local_100);
  OutputFlateEncodeStream::~OutputFlateEncodeStream(&local_b0);
  InputFlateDecodeStream::~InputFlateDecodeStream(&local_88);
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  OutputFile::~OutputFile(&local_60);
  return (uint)!bVar6;
}

Assistant:

int InputFlateDecodeTester(int argc, char* argv[])
{
	OutputFile outputFile;
	string aString("hello world");
	IOBasicTypes::Byte buffer;
	InputFlateDecodeStream inputDecoder;
	OutputFlateEncodeStream outputEncoder;

	outputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	outputEncoder.Assign(outputFile.GetOutputStream());
	outputEncoder.Write((IOBasicTypes::Byte*)aString.c_str(),aString.size());
	outputEncoder.Assign(NULL);
	outputFile.CloseFile();

	InputFile inputFile;
	inputFile.OpenFile(BuildRelativeOutputPath(argv,"source.txt"));
	inputDecoder.Assign(inputFile.GetInputStream());

	bool isSame = true;
	int i=0;
	string::iterator it = aString.begin();

	for(; it != aString.end() && isSame;++it,++i)
	{
		LongBufferSizeType amountRead = inputDecoder.Read(&buffer,1);

		if(amountRead != 1)
		{
			cout<<"Read failes. expected "<<1<<" characters. Found"<<amountRead<<"\n";
			isSame = false;
			break;
		}
		isSame = (*it) == buffer;

	}

	inputDecoder.Assign(NULL);
	inputFile.CloseFile();

	if(!isSame)
	{
		cout<<"Read failes. different characters than what expected\n";
		return 1;
	}
	else
		return 0;

}